

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateType.h
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::SilentAggregateSystem::SetAggregateType
          (SilentAggregateSystem *this,AggregateType *A)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  
  KVar1 = A->m_ui8Domain;
  KVar2 = A->m_ui16Country;
  KVar3 = A->m_ui8Category;
  KVar4 = A->m_ui8SubCategory;
  KVar5 = A->m_ui8Specific;
  KVar6 = A->m_ui8Extra;
  (this->m_AggTyp).m_ui8Kind = A->m_ui8Kind;
  (this->m_AggTyp).m_ui8Domain = KVar1;
  (this->m_AggTyp).m_ui16Country = KVar2;
  (this->m_AggTyp).m_ui8Category = KVar3;
  (this->m_AggTyp).m_ui8SubCategory = KVar4;
  (this->m_AggTyp).m_ui8Specific = KVar5;
  (this->m_AggTyp).m_ui8Extra = KVar6;
  return;
}

Assistant:

class KDIS_EXPORT AggregateType : public DataTypeBase
{
protected:

    KUINT8 m_ui8Kind;

    KUINT8 m_ui8Domain;

    KUINT16 m_ui16Country;

    KUINT8 m_ui8Category;

    KUINT8 m_ui8SubCategory;

    KUINT8 m_ui8Specific;

    KUINT8 m_ui8Extra;

public:

    static const KUINT16 AGGREGATE_TYPE_SIZE = 8;

    AggregateType();

    AggregateType( KDIS::DATA_TYPE::ENUMS::AggregateKind Kind, KUINT8 Domain, KDIS::DATA_TYPE::ENUMS::Country Country,
                   KUINT8  Categoy, KUINT8  SubCategory, KUINT8  Specific, KUINT8  Extra );

    AggregateType( KUINT8 Kind, KUINT8  Domain, KUINT8 Country, KUINT8  Categoy,
                   KUINT8  SubCategory, KUINT8  Specific, KUINT8  Extra );

    AggregateType(KDataStream &stream) noexcept(false);

    virtual ~AggregateType();

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateType::SetEntityKind
    //              KDIS::DATA_TYPE::AggregateType::GetEntityKind
    // Description: Kind
    // Parameter:   AggregateKind UI, void
    //************************************
    void SetEntityKind( KDIS::DATA_TYPE::ENUMS::AggregateKind AK );
    KDIS::DATA_TYPE::ENUMS::AggregateKind GetEntityKind() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateType::SetDomain
    //              KDIS::DATA_TYPE::AggregateType::GetDomain
    // Description: Domain - Same as Entity Type record
    // Parameter:   EntityDomain  UI, void
    //************************************
    void SetDomain( KDIS::DATA_TYPE::ENUMS::EntityDomain UI );
    KDIS::DATA_TYPE::ENUMS::EntityDomain GetDomain() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateType::SetCountry
    //              KDIS::DATA_TYPE::AggregateType::GetCountry
    // Description: Country
    // Parameter:   Country UI, void
    //************************************
    void SetCountry( KDIS::DATA_TYPE::ENUMS::Country UI );
    KDIS::DATA_TYPE::ENUMS::Country GetCountry() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateType::SetCategory
    //              KDIS::DATA_TYPE::AggregateType::GetCategory
    // Description: Category
    // Parameter:   KUINT8 UI, void
    //************************************
    void SetCategory( KUINT8 UI );
    KUINT8 GetCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateType::SetSubCategory
    //              KDIS::DATA_TYPE::AggregateType::GetSubCategory
    // Description: Sub Category
    // Parameter:   KUINT8 UI, void
    //************************************
    void SetSubCategory( KUINT8 UI );
    KUINT8 GetSubCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateType::SetSpecific
    //              KDIS::DATA_TYPE::AggregateType::GetSpecific
    // Description: Specific
    // Parameter:   KUINT8 UI, void
    //************************************
    void SetSpecific( KUINT8 UI );
    KUINT8 GetSpecific() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateType::SetExtra
    //              KDIS::DATA_TYPE::AggregateType::GetExtra
    // Description: Extra
    // Parameter:   KUINT8  UI, void
    //************************************
    void SetExtra( KUINT8 UI );
    KUINT8 GetExtra() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateType::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateType::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateType::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const AggregateType & Value ) const;
    KBOOL operator != ( const AggregateType & Value ) const;
    KBOOL operator  < ( const AggregateType & Value ) const;
}